

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

size_t filemgr_actual_stale_length(filemgr *file,bid_t offset,size_t length)

{
  bid_t end_bid;
  bid_t start_bid;
  size_t actual_len;
  size_t length_local;
  bid_t offset_local;
  filemgr *file_local;
  
  actual_len = length + ((offset + length) / (ulong)file->blocksize - offset / file->blocksize);
  if ((offset + actual_len) % (ulong)file->blocksize == (ulong)(file->blocksize - 1)) {
    actual_len = actual_len + 1;
  }
  return actual_len;
}

Assistant:

size_t filemgr_actual_stale_length(struct filemgr *file,
                                   bid_t offset,
                                   size_t length)
{
    size_t actual_len;
    bid_t start_bid, end_bid;

    start_bid = offset / file->blocksize;
    end_bid = (offset + length) / file->blocksize;

    actual_len = length + (end_bid - start_bid);
    if ((offset + actual_len) % file->blocksize ==
        file->blocksize - 1) {
        actual_len += 1;
    }

    return actual_len;
}